

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void __thiscall google::LogMessage::SaveOrSendToLog(LogMessage *this)

{
  LogMessageData *pLVar1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pLVar1 = this->data_;
  this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
            (pLVar1->field_6).sink_;
  if (this_00 != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
    sVar2 = pLVar1->num_prefix_chars_;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,pLVar1->message_text_ + sVar2,
               pLVar1->message_text_ +
               (long)(int)(~(uint)sVar2 + (int)pLVar1->num_chars_to_log_) + sVar2);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(this_00,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  SendToLog(this);
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  if (data_->outvec_ != NULL) {
    RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
               data_->message_text_[data_->num_chars_to_log_-1] == '\n', "");
    // Omit prefix of message and trailing newline when recording in outvec_.
    const char *start = data_->message_text_ + data_->num_prefix_chars_;
    int len = data_->num_chars_to_log_ - data_->num_prefix_chars_ - 1;
    data_->outvec_->push_back(string(start, len));
  } else {
    SendToLog();
  }
}